

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O0

rt_expression_interface<double> * __thiscall
viennamath::
op_unary<viennamath::op_rt_symbolic_integral<viennamath::rt_expression_interface<double>_>,_viennamath::rt_expression_interface<double>_>
::simplify(op_unary<viennamath::op_rt_symbolic_integral<viennamath::rt_expression_interface<double>_>,_viennamath::rt_expression_interface<double>_>
           *this,rt_expression_interface<double> *lhs,rt_expression_interface<double> *rhs)

{
  int iVar1;
  int iVar2;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *this_00;
  undefined4 extraout_var;
  op_unary<viennamath::op_rt_symbolic_integral<viennamath::rt_expression_interface<double>_>,_viennamath::rt_expression_interface<double>_>
  *this_01;
  undefined4 extraout_var_00;
  rt_expression_interface<double> *rhs_local;
  rt_expression_interface<double> *lhs_local;
  op_unary<viennamath::op_rt_symbolic_integral<viennamath::rt_expression_interface<double>_>,_viennamath::rt_expression_interface<double>_>
  *this_local;
  
  this_00 = (rt_binary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x20);
  iVar1 = (*lhs->_vptr_rt_expression_interface[2])();
  this_01 = (op_unary<viennamath::op_rt_symbolic_integral<viennamath::rt_expression_interface<double>_>,_viennamath::rt_expression_interface<double>_>
             *)operator_new(0x10);
  op_unary(this_01);
  iVar2 = (*rhs->_vptr_rt_expression_interface[2])();
  rt_binary_expr<viennamath::rt_expression_interface<double>_>::rt_binary_expr
            (this_00,(rt_expression_interface<double> *)CONCAT44(extraout_var,iVar1),
             (op_interface_type *)this_01,
             (rt_expression_interface<double> *)CONCAT44(extraout_var_00,iVar2));
  return &this_00->super_rt_expression_interface<double>;
}

Assistant:

InterfaceType * op_unary<T, InterfaceType>::simplify(const InterfaceType * lhs,
                                                       const InterfaceType * rhs) const
  {
    return new rt_binary_expr<InterfaceType>(lhs->clone(),
                                          new op_unary<T, InterfaceType>(),
                                          rhs->clone());
  }